

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location)

{
  bool bVar1;
  int iVar2;
  FieldOptions *this_00;
  LocationRecorder location;
  LocationRecorder local_40;
  
  iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  bVar1 = true;
  if (iVar2 == 0) {
    LocationRecorder::Init(&local_40,field_location);
    LocationRecorder::AddPath(&local_40,8);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar2 == 0) {
          bVar1 = ParseDefaultAssignment(this,field,field_location);
        }
        else {
          *(byte *)field->_has_bits_ = (byte)field->_has_bits_[0] | 0x80;
          this_00 = field->options_;
          if (this_00 == (FieldOptions *)0x0) {
            this_00 = (FieldOptions *)operator_new(0x70);
            FieldOptions::FieldOptions(this_00);
            field->options_ = this_00;
          }
          bVar1 = ParseOption(this,&this_00->super_Message,&local_40,OPTION_ASSIGNMENT);
        }
        if (bVar1 == false) goto LAB_0021795d;
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar1 = Consume(this,"]");
    }
    else {
LAB_0021795d:
      bVar1 = false;
    }
    LocationRecorder::~LocationRecorder(&local_40);
  }
  return bVar1;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location));
    } else {
      DO(ParseOption(field->mutable_options(), location, OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}